

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_unlink_internal(lyd_node *node,int permanent)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR *pLVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  
  if (node == (lyd_node *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINVAL;
    iVar4 = 1;
  }
  else {
    if (permanent != 0) {
      check_leaf_list_backlinks(node,1);
    }
    plVar1 = node->next;
    plVar2 = node->prev;
    if (plVar2->next != (lyd_node *)0x0) {
      plVar2->next = plVar1;
    }
    if (plVar1 == (lyd_node *)0x0) {
      plVar6 = node->parent;
      plVar3 = plVar2;
      if (plVar6 == (lyd_node *)0x0) {
        do {
          plVar7 = plVar3;
          plVar3 = plVar7->prev;
        } while (plVar7->prev != node);
      }
      else {
        plVar7 = plVar6->child;
      }
      plVar7->prev = plVar2;
    }
    else {
      plVar1->prev = plVar2;
      plVar6 = node->parent;
    }
    if (plVar6 != (lyd_node *)0x0) {
      if (plVar6->child == node) {
        plVar6->child = plVar1;
      }
      node->parent = (lyd_node *)0x0;
    }
    node->next = (lyd_node *)0x0;
    node->prev = node;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
lyd_unlink_internal(struct lyd_node *node, int permanent)
{
    struct lyd_node *iter;

    if (!node) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (permanent) {
        check_leaf_list_backlinks(node, 1);
    }

    /* unlink from siblings */
    if (node->prev->next) {
        node->prev->next = node->next;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last node */
        if (node->parent) {
            iter = node->parent->child;
        } else {
            iter = node->prev;
            while (iter->prev != node) {
                iter = iter->prev;
            }
        }
        /* update the "last" pointer from the first node */
        iter->prev = node->prev;
    }

    /* unlink from parent */
    if (node->parent) {
        if (node->parent->child == node) {
            /* the node is the first child */
            node->parent->child = node->next;
        }
        node->parent = NULL;
    }

    node->next = NULL;
    node->prev = node;

    return EXIT_SUCCESS;
}